

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::DropTypes(TypeChecker *this,size_t drop_count)

{
  const_iterator __last;
  Result RVar1;
  Enum EVar2;
  Label *label;
  
  RVar1 = TopLabel(this,&label);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    __last._M_current =
         (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current -
                (long)(this->type_stack_).
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) < label->type_stack_limit + drop_count)
    {
      ResetTypeStackToLabel(this,label);
      EVar2 = label->unreachable ^ Error;
    }
    else {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::erase
                (&this->type_stack_,__last._M_current + -drop_count,__last);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::DropTypes(size_t drop_count) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->type_stack_limit + drop_count > type_stack_.size()) {
    ResetTypeStackToLabel(label);
    return label->unreachable ? Result::Ok : Result::Error;
  }
  type_stack_.erase(type_stack_.end() - drop_count, type_stack_.end());
  return Result::Ok;
}